

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O1

iterator __thiscall
phmap::priv::
base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
::lower_bound(base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
              *this,key_type *key)

{
  _Rb_tree_iterator<std::pair<const_long,_long>_> checker_iter;
  _Base_ptr p_Var1;
  iterator tree_iter;
  iterator iVar3;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
  bVar2;
  
  tree_iter = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
              ::lower_bound<long>((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                                   *)this,key);
  p_Var1 = (this->checker_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  checker_iter._M_node = &(this->checker_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var1 != (_Base_ptr)0x0) {
    do {
      if (*key <= *(long *)(p_Var1 + 1)) {
        checker_iter._M_node = p_Var1;
      }
      p_Var1 = (&p_Var1->_M_left)[*(long *)(p_Var1 + 1) < *key];
    } while (p_Var1 != (_Base_ptr)0x0);
  }
  bVar2 = base_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>
          ::
          iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>,std::pair<long_const,long>&,std::pair<long_const,long>*>,std::_Rb_tree_iterator<std::pair<long_const,long>>>
                    ((base_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>
                      *)this,tree_iter,checker_iter);
  iVar3.node = bVar2.node;
  iVar3.position = bVar2.position;
  iVar3._12_4_ = bVar2._12_4_;
  return iVar3;
}

Assistant:

iterator lower_bound(const key_type &key) {
        return iter_check(tree_.lower_bound(key), checker_.lower_bound(key));
    }